

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::VarintSize<true,false,int>(int *data,int n)

{
  uint32 uVar1;
  uint in_ESI;
  long in_RDI;
  uint32 x;
  int i;
  uint32 msb_sum;
  uint32 sum;
  undefined4 local_18;
  undefined4 local_10;
  
  local_10 = in_ESI;
  for (local_18 = 0; local_18 < (int)in_ESI; local_18 = local_18 + 1) {
    uVar1 = WireFormatLite::ZigZagEncode32(*(int32 *)(in_RDI + (long)local_18 * 4));
    if (0x7f < uVar1) {
      local_10 = local_10 + 1;
    }
    if (0x3fff < uVar1) {
      local_10 = local_10 + 1;
    }
    if (0x1fffff < uVar1) {
      local_10 = local_10 + 1;
    }
    if (0xfffffff < uVar1) {
      local_10 = local_10 + 1;
    }
  }
  return (ulong)local_10;
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
#if __cplusplus >= 201103L
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
#endif
  uint32 sum = n;
  uint32 msb_sum = 0;
  for (int i = 0; i < n; i++) {
    uint32 x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SSE sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}